

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode Curl_mime_prepare_headers
                   (Curl_easy *data,curl_mimepart *part,char *contenttype,char *disposition,
                   mimestrategy strategy)

{
  curl_slist **slp;
  bool bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  curl_mimepart *part_00;
  char *pcVar12;
  char *local_50;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar5 = part->mimetype;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = search_header(part->userheaders,"Content-Type",0xc);
  }
  if (pcVar5 != (char *)0x0) {
    contenttype = pcVar5;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (((contenttype == (char *)0x0) &&
          (contenttype = Curl_mime_contenttype(part->data), contenttype == (char *)0x0)) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    part_00 = (curl_mimepart *)part->arg;
    ppcVar7 = &part_00->data;
    if (part_00 == (curl_mimepart *)0x0) {
      ppcVar7 = (char **)0x0;
    }
  }
  else {
    if (((pcVar5 == (char *)0x0) && (contenttype != (char *)0x0)) &&
       ((_Var2 = content_type_match(contenttype,"text/plain",10), _Var2 &&
        ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))))) {
      contenttype = (char *)0x0;
    }
    part_00 = (curl_mimepart *)0x0;
    ppcVar7 = (char **)0x0;
  }
  slp = &part->curlheaders;
  pcVar5 = search_header(part->userheaders,"Content-Disposition",0x13);
  if (pcVar5 == (char *)0x0) {
    if (((disposition != (char *)0x0) || (disposition = "attachment", part->filename != (char *)0x0)
        ) || (part->name != (char *)0x0)) {
LAB_0013ef82:
      iVar4 = curl_strequal(disposition,"attachment");
      pcVar5 = part->name;
      CVar3 = CURLE_OUT_OF_MEMORY;
      if (iVar4 == 0) {
        if (pcVar5 != (char *)0x0) goto LAB_0013efb8;
LAB_0013efde:
        pcVar5 = (char *)0x0;
LAB_0013efe0:
        if (part->filename == (char *)0x0) {
          local_50 = (char *)0x0;
        }
        else {
          local_50 = escape_string(data,part->filename,strategy);
          if (local_50 == (char *)0x0) {
            local_50 = (char *)0x0;
            goto LAB_0013f086;
          }
        }
        pcVar6 = "; name=\"";
        pcVar8 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          pcVar6 = "";
          pcVar8 = "";
        }
        pcVar10 = "\"";
        pcVar9 = "\"";
        if (pcVar5 == (char *)0x0) {
          pcVar9 = "";
        }
        pcVar11 = "; filename=\"";
        pcVar12 = local_50;
        if (local_50 == (char *)0x0) {
          pcVar11 = "";
          pcVar12 = "";
          pcVar10 = "";
        }
        CVar3 = Curl_mime_add_header
                          (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar6,pcVar8,
                           pcVar9,pcVar11,pcVar12,pcVar10);
      }
      else {
        if (pcVar5 == (char *)0x0) {
          if (part->filename == (char *)0x0) goto LAB_0013ef1a;
          goto LAB_0013efde;
        }
LAB_0013efb8:
        pcVar5 = escape_string(data,pcVar5,strategy);
        if (pcVar5 != (char *)0x0) goto LAB_0013efe0;
        local_50 = (char *)0x0;
        pcVar5 = (char *)0x0;
      }
LAB_0013f086:
      (*Curl_cfree)(pcVar5);
      (*Curl_cfree)(local_50);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      goto LAB_0013ef1a;
    }
    if (contenttype == (char *)0x0) goto LAB_0013f0c8;
    iVar4 = curl_strnequal(contenttype,"multipart/",10);
    if (iVar4 == 0) goto LAB_0013ef82;
LAB_0013ef23:
    pcVar5 = "; boundary=";
    if (ppcVar7 == (char **)0x0) {
      pcVar5 = "";
      ppcVar7 = (char **)0x17eb0e;
    }
    CVar3 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar5,ppcVar7);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    bVar1 = true;
  }
  else {
LAB_0013ef1a:
    if (contenttype != (char *)0x0) goto LAB_0013ef23;
LAB_0013f0c8:
    bVar1 = false;
  }
  pcVar5 = search_header(part->userheaders,"Content-Transfer-Encoding",0x19);
  if (pcVar5 == (char *)0x0) {
    if (part->encoder == (mime_encoder *)0x0) {
      if ((!bVar1 || strategy != MIMESTRATEGY_MAIL) || (part->kind == MIMEKIND_MULTIPART))
      goto LAB_0013f0e2;
      pcVar5 = "8bit";
    }
    else {
      pcVar5 = part->encoder->name;
      if (pcVar5 == (char *)0x0) goto LAB_0013f0e2;
    }
    CVar3 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s",pcVar5);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
  }
LAB_0013f0e2:
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = part->curlheaders;
    (part->state).offset = 0;
  }
  CVar3 = CURLE_OK;
  if ((part_00 != (curl_mimepart *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    _Var2 = content_type_match(contenttype,"multipart/form-data",0x13);
    pcVar5 = "form-data";
    if (!_Var2) {
      pcVar5 = (char *)0x0;
    }
    do {
      part_00 = part_00->nextpart;
      if (part_00 == (curl_mimepart *)0x0) {
        return CURLE_OK;
      }
      CVar3 = Curl_mime_prepare_headers(data,part_00,(char *)0x0,pcVar5,strategy);
    } while (CVar3 == CURLE_OK);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_mime_prepare_headers(struct Curl_easy *data,
                                   curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we will not access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, STRCONST("Content-Type"));
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          content_type_match(contenttype, STRCONST("text/plain")))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, STRCONST("Content-Disposition"))) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(data, part->name, strategy);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(data, part->filename, strategy);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name ? "; name=\"" : "",
                                   name ? name : "",
                                   name ? "\"" : "",
                                   filename ? "; filename=\"" : "",
                                   filename ? filename : "",
                                   filename ? "\"" : "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders,
                    STRCONST("Content-Transfer-Encoding"))) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(content_type_match(contenttype, STRCONST("multipart/form-data")))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(data, subpart, NULL,
                                      disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}